

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep.c
# Opt level: O1

int arkStep_Predict(ARKodeMem ark_mem,int istage,N_Vector yguess)

{
  double *pdVar1;
  double dVar2;
  void *pvVar3;
  realtype *c;
  long lVar4;
  N_Vector *X;
  uint nvec;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  char *msgfmt;
  long lVar8;
  ulong uVar9;
  bool bVar10;
  double tau;
  double dVar11;
  
  pvVar3 = ark_mem->step_mem;
  if (pvVar3 == (void *)0x0) {
    msgfmt = "Time step module memory is NULL.";
    ark_mem = (ARKodeMem)0x0;
  }
  else {
    if ((ark_mem->interp != (ARKInterp)0x0) || (2 < *(int *)((long)pvVar3 + 0xb0) - 1U)) {
      if ((ark_mem->initsetup == 0) && (*(int *)((long)pvVar3 + 0xb0) - 1U < 5)) {
        c = *(realtype **)((long)pvVar3 + 0x198);
        lVar4 = *(long *)(*(long *)((long)pvVar3 + 0x68) + 0x18);
        lVar8 = (long)istage;
        dVar2 = ark_mem->h;
        tau = *(double *)(lVar4 + lVar8 * 8) * dVar2;
        dVar11 = tau / ark_mem->hold;
        X = *(N_Vector **)((long)pvVar3 + 0x1a0);
        switch(*(int *)((long)pvVar3 + 0xb0)) {
        case 1:
          iVar6 = arkPredict_MaximumOrder(ark_mem,dVar11,yguess);
          break;
        case 2:
          iVar6 = arkPredict_VariableOrder(ark_mem,dVar11,yguess);
          break;
        case 3:
          iVar6 = arkPredict_CutoffOrder(ark_mem,dVar11,yguess);
          break;
        case 4:
          if (istage < 1) {
            uVar7 = 0xffffffff;
          }
          else {
            uVar7 = 0xffffffff;
            uVar5 = 0;
            do {
              pdVar1 = (double *)(lVar4 + uVar5 * 8);
              if (*pdVar1 != 0.0) {
                uVar7 = uVar5 & 0xffffffff;
              }
              if (NAN(*pdVar1)) {
                uVar7 = uVar5 & 0xffffffff;
              }
              uVar5 = uVar5 + 1;
            } while ((uint)istage != uVar5);
          }
          iVar6 = (int)uVar7;
          if (iVar6 == -1) goto LAB_004de2ec;
          if (0 < istage) {
            uVar5 = 0;
            do {
              dVar11 = *(double *)(lVar4 + uVar5 * 8);
              pdVar1 = (double *)(lVar4 + (long)(int)uVar7 * 8);
              uVar9 = uVar5 & 0xffffffff;
              if (dVar11 < *pdVar1 || dVar11 == *pdVar1) {
                uVar9 = uVar7;
              }
              if (dVar11 != 0.0) {
                uVar7 = uVar9;
              }
              if (NAN(dVar11)) {
                uVar7 = uVar9;
              }
              iVar6 = (int)uVar7;
              uVar5 = uVar5 + 1;
            } while ((uint)istage != uVar5);
          }
          lVar8 = (long)iVar6;
          dVar11 = *(double *)(lVar4 + lVar8 * 8);
          bVar10 = *(int *)((long)pvVar3 + 0x1c) != 0;
          if (bVar10) {
            *c = 1.0;
            *X = *(N_Vector *)(*(long *)((long)pvVar3 + 0x30) + lVar8 * 8);
          }
          nvec = (uint)bVar10;
          if (*(int *)((long)pvVar3 + 0x18) != 0) {
            *(undefined8 *)((long)c + (ulong)(nvec * 8)) = 0x3ff0000000000000;
            *(undefined8 *)((long)X + (ulong)(nvec * 8)) =
                 *(undefined8 *)(*(long *)((long)pvVar3 + 0x28) + lVar8 * 8);
            nvec = nvec + 1;
          }
          iVar6 = arkPredict_Bootstrap(ark_mem,dVar2 * dVar11,tau,nvec,c,X,yguess);
          break;
        case 5:
          uVar7 = 0;
          if (0 < istage && *(int *)((long)pvVar3 + 0x18) != 0) {
            uVar7 = 0;
            do {
              c[uVar7] = ark_mem->h *
                         *(double *)
                          (*(long *)(*(long *)(*(long *)((long)pvVar3 + 0x60) + 0x10) + lVar8 * 8) +
                          uVar7 * 8);
              X[uVar7] = *(N_Vector *)(*(long *)((long)pvVar3 + 0x28) + uVar7 * 8);
              uVar7 = uVar7 + 1;
            } while ((uint)istage != uVar7);
          }
          iVar6 = (int)uVar7;
          if (0 < istage && *(int *)((long)pvVar3 + 0x1c) != 0) {
            uVar5 = 0;
            do {
              c[(uVar7 & 0xffffffff) + uVar5] =
                   ark_mem->h *
                   *(double *)
                    (*(long *)(*(long *)(*(long *)((long)pvVar3 + 0x68) + 0x10) + lVar8 * 8) +
                    uVar5 * 8);
              X[(uVar7 & 0xffffffff) + uVar5] =
                   *(N_Vector *)(*(long *)((long)pvVar3 + 0x30) + uVar5 * 8);
              uVar5 = uVar5 + 1;
            } while ((uint)istage != uVar5);
            iVar6 = iVar6 + (int)uVar5;
          }
          c[iVar6] = 1.0;
          X[iVar6] = ark_mem->yn;
          iVar6 = N_VLinearCombination(iVar6 + 1,c,X,yguess);
          if (iVar6 != 0) {
            return -0x1c;
          }
          return 0;
        }
        if (iVar6 != -0x16) {
          return iVar6;
        }
      }
LAB_004de2ec:
      N_VScale(1.0,ark_mem->yn,yguess);
      return 0;
    }
    msgfmt = "Interpolation structure is NULL";
  }
  arkProcessError(ark_mem,-0x15,"ARKode::ARKStep","arkStep_Predict",msgfmt);
  return -0x15;
}

Assistant:

int arkStep_Predict(ARKodeMem ark_mem, int istage, N_Vector yguess)
{
  int i, retval, jstage, nvec;
  realtype tau;
  realtype h;
  ARKodeARKStepMem step_mem;
  realtype* cvals;
  N_Vector* Xvecs;

  /* access ARKodeARKStepMem structure */
  if (ark_mem->step_mem == NULL) {
    arkProcessError(NULL, ARK_MEM_NULL, "ARKode::ARKStep",
                    "arkStep_Predict", MSG_ARKSTEP_NO_MEM);
    return(ARK_MEM_NULL);
  }
  step_mem = (ARKodeARKStepMem) ark_mem->step_mem;

  /* verify that interpolation structure is provided */
  if ((ark_mem->interp == NULL) && (step_mem->predictor > 0) && (step_mem->predictor < 4)) {
    arkProcessError(ark_mem, ARK_MEM_NULL, "ARKode::ARKStep",
                    "arkStep_Predict",
                    "Interpolation structure is NULL");
    return(ARK_MEM_NULL);
  }

  /* local shortcuts for use with fused vector operations */
  cvals = step_mem->cvals;
  Xvecs = step_mem->Xvecs;

  /* if the first step, use initial condition as guess */
  if (ark_mem->initsetup) {
    N_VScale(ONE, ark_mem->yn, yguess);
    return(ARK_SUCCESS);
  }

  /* set evaluation time tau as relative shift from previous successful time */
  tau = step_mem->Bi->c[istage]*ark_mem->h/ark_mem->hold;

  /* use requested predictor formula */
  switch (step_mem->predictor) {

  case 1:

    /***** Interpolatory Predictor 1 -- all to max order *****/
    retval = arkPredict_MaximumOrder(ark_mem, tau, yguess);
    if (retval != ARK_ILL_INPUT)  return(retval);
    break;

  case 2:

    /***** Interpolatory Predictor 2 -- decrease order w/ increasing level of extrapolation *****/
    retval = arkPredict_VariableOrder(ark_mem, tau, yguess);
    if (retval != ARK_ILL_INPUT)  return(retval);
    break;

  case 3:

    /***** Cutoff predictor: max order interpolatory output for stages "close"
           to previous step, first-order predictor for subsequent stages *****/
    retval = arkPredict_CutoffOrder(ark_mem, tau, yguess);
    if (retval != ARK_ILL_INPUT)  return(retval);
    break;

  case 4:

    /***** Bootstrap predictor: if any previous stage in step has nonzero c_i,
           construct a quadratic Hermite interpolant for prediction; otherwise
           use the trivial predictor.  The actual calculations are performed in
           arkPredict_Bootstrap, but here we need to determine the appropriate
           stage, c_j, to use. *****/

    /* determine if any previous stages in step meet criteria */
    jstage = -1;
    for (i=0; i<istage; i++)
      jstage = (step_mem->Bi->c[i] != ZERO) ? i : jstage;

    /* if using the trivial predictor, break */
    if (jstage == -1)  break;

    /* find the "optimal" previous stage to use */
    for (i=0; i<istage; i++)
      if ( (step_mem->Bi->c[i] > step_mem->Bi->c[jstage]) &&
           (step_mem->Bi->c[i] != ZERO) )
        jstage = i;

    /* set stage time, stage RHS and interpolation values */
    h = ark_mem->h * step_mem->Bi->c[jstage];
    tau = ark_mem->h * step_mem->Bi->c[istage];
    nvec = 0;
    if (step_mem->implicit) {    /* Implicit piece */
      cvals[nvec] = ONE;
      Xvecs[nvec] = step_mem->Fi[jstage];
      nvec += 1;
    }
    if (step_mem->explicit) {    /* Explicit piece */
      cvals[nvec] = ONE;
      Xvecs[nvec] = step_mem->Fe[jstage];
      nvec += 1;
    }

    /* call predictor routine */
    retval = arkPredict_Bootstrap(ark_mem, h, tau, nvec, cvals, Xvecs, yguess);
    if (retval != ARK_ILL_INPUT)  return(retval);
    break;

  case 5:

    /***** Minimal correction predictor: use all previous stage
           information in this step *****/

    /* set arrays for fused vector operation */
    nvec = 0;
    if (step_mem->explicit) {       /* Explicit pieces */
      for (jstage=0; jstage<istage; jstage++) {
        cvals[nvec] = ark_mem->h * step_mem->Be->A[istage][jstage];
        Xvecs[nvec] = step_mem->Fe[jstage];
        nvec += 1;
      }
    }
    if (step_mem->implicit) {      /* Implicit pieces */
      for (jstage=0; jstage<istage; jstage++) {
        cvals[nvec] = ark_mem->h * step_mem->Bi->A[istage][jstage];
        Xvecs[nvec] = step_mem->Fi[jstage];
        nvec += 1;
      }
    }
    cvals[nvec] = ONE;
    Xvecs[nvec] = ark_mem->yn;
    nvec += 1;

    /* compute predictor */
    retval = N_VLinearCombination(nvec, cvals, Xvecs, yguess);
    if (retval != 0) return(ARK_VECTOROP_ERR);
    return(ARK_SUCCESS);
    break;

  }

  /* if we made it here, use the trivial predictor (previous step solution) */
  N_VScale(ONE, ark_mem->yn, yguess);
  return(ARK_SUCCESS);
}